

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::Desc::Desc(Desc *this,SPxSolverBase<double> *base)

{
  Representation RVar1;
  SPxSolverBase<double> *in_RSI;
  Desc *in_RDI;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Desc *this_00;
  
  this_00 = in_RDI;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray
            (&in_RDI->rowstat,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (Real)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray
            (&this_00->rowstat,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (Real)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2dc096);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2dc0a6);
  reSize(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  RVar1 = SPxSolverBase<double>::rep(in_RSI);
  if (RVar1 == ROW) {
    in_RDI->stat = &in_RDI->rowstat;
    in_RDI->costat = &in_RDI->colstat;
  }
  else {
    in_RDI->stat = &in_RDI->colstat;
    in_RDI->costat = &in_RDI->rowstat;
  }
  return;
}

Assistant:

SPxBasisBase<R>::Desc::Desc(const SPxSolverBase<R>& base)
{
   reSize(base.nRows(), base.nCols());

   if(base.rep() == SPxSolverBase<R>::ROW)
   {
      stat   = &rowstat;
      costat = &colstat;
   }
   else
   {
      assert(base.rep() == SPxSolverBase<R>::COLUMN);

      stat   = &colstat;
      costat = &rowstat;
   }

   assert(Desc::isConsistent());
}